

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O0

ImgClass * __thiscall Webcam::getImg(ImgClass *__return_storage_ptr__,Webcam *this)

{
  size_t sVar1;
  Webcam *this_local;
  ImgClass *img;
  
  std::mutex::lock(&imgLock);
  sVar1 = jpgClean(imgBuffer[readyImgPos].data,(long)imgBuffer[readyImgPos].size);
  imgBuffer[readyImgPos].size = (int)sVar1;
  ImgClass::ImgClass(__return_storage_ptr__,imgBuffer + readyImgPos);
  std::mutex::unlock(&imgLock);
  return __return_storage_ptr__;
}

Assistant:

ImgClass Webcam::getImg()
{
#ifdef USE_WEBCAM_DEBUG
    cout<<"Webcam::getImg"<<endl;
    cout<<"imgBuffer[readyImgPos].size = "<<imgBuffer[readyImgPos].size<<endl;
#endif
    imgLock.lock();
    imgBuffer[readyImgPos].size = jpgClean(imgBuffer[readyImgPos].data, imgBuffer[readyImgPos].size);
    auto img = ImgClass(imgBuffer[readyImgPos]);
    imgLock.unlock();
    return img;
}